

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::updateTransitionMatrices
          (EigenDecompositionCube<float,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,float **transitionMatrices,int count)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  long lVar11;
  int i;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  float *pfVar18;
  int i_1;
  int iVar19;
  double dVar20;
  undefined1 auVar21 [16];
  float sumD1;
  undefined1 auVar22 [16];
  float sumD2;
  undefined1 auVar23 [16];
  
  uVar16 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar17 = (ulong)uVar16;
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    for (uVar8 = 0; uVar8 != (uint)(~(count >> 0x1f) & count); uVar8 = uVar8 + 1) {
      iVar19 = 0;
      pfVar2 = transitionMatrices[probabilityIndices[uVar8]];
      for (lVar11 = 0; lVar11 < (this->super_EigenDecomposition<float,_1>).kCategoryCount;
          lVar11 = lVar11 + 1) {
        lVar12 = 0;
        while( true ) {
          uVar7 = (uint)uVar17;
          lVar5 = (long)(int)uVar7;
          if (lVar5 <= lVar12) break;
          dVar20 = exp((double)(float)edgeLengths[uVar8] * categoryRates[lVar11] *
                       (double)(this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex]
                               [lVar12]);
          (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar12] = (float)dVar20;
          lVar12 = lVar12 + 1;
          uVar17 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kStateCount;
        }
        pfVar10 = this->gCMatrices[eigenIndex];
        for (uVar15 = 0; uVar15 != (~((int)uVar7 >> 0x1f) & uVar7); uVar15 = uVar15 + 1) {
          iVar6 = uVar7 + iVar19;
          for (lVar12 = (long)iVar19; lVar12 != iVar6; lVar12 = lVar12 + 1) {
            pfVar3 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
            auVar21 = ZEXT816(0) << 0x40;
            pfVar18 = pfVar10;
            for (lVar13 = 0; lVar13 < (int)uVar16 / 4 << 2; lVar13 = lVar13 + 4) {
              pfVar18 = pfVar18 + 4;
              auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)pfVar10[lVar13]),
                                        ZEXT416((uint)pfVar3[lVar13]));
              auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)pfVar10[lVar13 + 1]),
                                        ZEXT416((uint)pfVar3[lVar13 + 1]));
              auVar21 = vfmadd132ss_fma(ZEXT416((uint)pfVar10[lVar13 + 2]),auVar21,
                                        ZEXT416((uint)pfVar3[lVar13 + 2]));
              auVar21 = vfmadd132ss_fma(ZEXT416((uint)pfVar10[lVar13 + 3]),auVar21,
                                        ZEXT416((uint)pfVar3[lVar13 + 3]));
            }
            for (; lVar13 < lVar5; lVar13 = lVar13 + 1) {
              fVar1 = *pfVar18;
              pfVar18 = pfVar18 + 1;
              auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar1),ZEXT416((uint)pfVar3[lVar13]));
            }
            auVar21 = vmaxss_avx(auVar21,ZEXT816(0) << 0x40);
            pfVar10 = pfVar10 + lVar5;
            pfVar2[lVar12] = auVar21._0_4_;
          }
          pfVar2[iVar6] = 1.0;
          iVar19 = iVar6 + 1;
        }
      }
    }
  }
  else {
    uVar8 = (ulong)(uint)(~(count >> 0x1f) & count);
    if (secondDerivativeIndices == (int *)0x0) {
      for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
        iVar19 = 0;
        pfVar2 = transitionMatrices[probabilityIndices[uVar14]];
        pfVar10 = transitionMatrices[firstDerivativeIndices[uVar14]];
        for (lVar11 = 0; lVar11 < (this->super_EigenDecomposition<float,_1>).kCategoryCount;
            lVar11 = lVar11 + 1) {
          for (lVar12 = 0; uVar16 = (uint)uVar17, lVar12 < (int)uVar16; lVar12 = lVar12 + 1) {
            fVar1 = (float)categoryRates[lVar11] *
                    (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex][lVar12];
            dVar20 = exp((double)(fVar1 * (float)edgeLengths[uVar14]));
            (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar12] = (float)dVar20;
            (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar12] = (float)dVar20 * fVar1
            ;
            uVar17 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kStateCount;
          }
          iVar6 = 0;
          for (uVar7 = 0; uVar7 != (~((int)uVar16 >> 0x1f) & uVar16); uVar7 = uVar7 + 1) {
            lVar5 = (long)(int)(uVar16 + iVar19);
            for (lVar12 = (long)iVar19; lVar12 != lVar5; lVar12 = lVar12 + 1) {
              auVar21 = ZEXT816(0) << 0x40;
              auVar22 = ZEXT816(0) << 0x40;
              for (uVar9 = 0; uVar17 != uVar9; uVar9 = uVar9 + 1) {
                auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)this->gCMatrices[eigenIndex]
                                                                [(long)iVar6 + uVar9]),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        matrixTmp[uVar9]));
                auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)this->gCMatrices[eigenIndex]
                                                                [(long)iVar6 + uVar9]),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        firstDerivTmp[uVar9]));
              }
              auVar21 = vmaxss_avx(auVar21,ZEXT816(0) << 0x40);
              iVar6 = iVar6 + uVar16;
              pfVar2[lVar12] = auVar21._0_4_;
              pfVar10[lVar12] = auVar22._0_4_;
            }
            pfVar2[lVar5] = 1.0;
            pfVar10[lVar5] = 0.0;
            iVar19 = uVar16 + iVar19 + 1;
          }
        }
      }
    }
    else {
      for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
        iVar19 = 0;
        pfVar2 = transitionMatrices[probabilityIndices[uVar14]];
        pfVar10 = transitionMatrices[firstDerivativeIndices[uVar14]];
        pfVar3 = transitionMatrices[secondDerivativeIndices[uVar14]];
        for (lVar11 = 0; lVar11 < (this->super_EigenDecomposition<float,_1>).kCategoryCount;
            lVar11 = lVar11 + 1) {
          for (lVar12 = 0; uVar16 = (uint)uVar17, lVar12 < (int)uVar16; lVar12 = lVar12 + 1) {
            fVar1 = (float)categoryRates[lVar11] *
                    (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex][lVar12];
            dVar20 = exp((double)(fVar1 * (float)edgeLengths[uVar14]));
            (this->super_EigenDecomposition<float,_1>).matrixTmp[lVar12] = (float)dVar20;
            fVar4 = fVar1 * (float)dVar20;
            (this->super_EigenDecomposition<float,_1>).firstDerivTmp[lVar12] = fVar4;
            (this->super_EigenDecomposition<float,_1>).secondDerivTmp[lVar12] = fVar1 * fVar4;
            uVar17 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kStateCount;
          }
          iVar6 = 0;
          for (uVar7 = 0; uVar7 != (~((int)uVar16 >> 0x1f) & uVar16); uVar7 = uVar7 + 1) {
            lVar5 = (long)(int)(uVar16 + iVar19);
            for (lVar12 = (long)iVar19; lVar12 != lVar5; lVar12 = lVar12 + 1) {
              auVar21 = ZEXT816(0) << 0x40;
              auVar22 = ZEXT816(0) << 0x40;
              auVar23 = ZEXT816(0) << 0x40;
              uVar9 = 0;
              while( true ) {
                if (uVar17 == uVar9) break;
                fVar1 = this->gCMatrices[eigenIndex][(long)iVar6 + uVar9];
                auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar1),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        matrixTmp[uVar9]));
                auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)fVar1),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        firstDerivTmp[uVar9]));
                auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar1),
                                          ZEXT416((uint)(this->super_EigenDecomposition<float,_1>).
                                                        secondDerivTmp[uVar9]));
                uVar9 = uVar9 + 1;
              }
              auVar21 = vmaxss_avx(auVar21,ZEXT816(0) << 0x40);
              iVar6 = iVar6 + uVar16;
              pfVar2[lVar12] = auVar21._0_4_;
              pfVar10[lVar12] = auVar22._0_4_;
              pfVar3[lVar12] = auVar23._0_4_;
            }
            pfVar2[lVar5] = 1.0;
            pfVar10[lVar5] = 0.0;
            pfVar3[lVar5] = 0.0;
            iVar19 = uVar16 + iVar19 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      const double* categoryRates,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
//	if (probabilityIndices == NULL) {  // used to store derivative matrices for derivatives through pre-order traversals
//
//	    if (secondDerivativeIndices == NULL) {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        firstDerivTmp[i] = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    } else {
//            for (int u = 0; u < count; u++) {
//                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
//                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
//                int n = 0;
//                for (int l = 0; l < kCategoryCount; l++) {
//
//                    for (int i = 0; i < kStateCount; i++) {
//                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
//                        firstDerivTmp[i] = scaledEigenValue;
//                        secondDerivTmp[i] = scaledEigenValue * ((REALTYPE)categoryRates[l]);
//                    }
//
//                    int m = 0;
//                    for (int i = 0; i < kStateCount; i++) {
//                        for (int j = 0; j < kStateCount; j++) {
//                            REALTYPE sumD1 = 0.0;
//                            REALTYPE sumD2 = 0.0;
//                            for (int k = 0; k < kStateCount; k++) {
//                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
//                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
//                                m++;
//                            }
//                            firstDerivMat[n] = sumD1;
//                            secondDerivMat[n] = sumD2;
//                            n++;
//                        }
//                        if (T_PAD != 0) {
//                            firstDerivMat[n] = 0.0;
//                            secondDerivMat[n] = 0.0;
//                            n += T_PAD;
//                        }
//                    }
//                }
//            }
//	    }
//
//	} else {

        if (firstDerivativeIndices == NULL &&secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        matrixTmp[i] = exp(gEigenValues[eigenIndex][i] * ((REALTYPE)edgeLengths[u] * categoryRates[l]));
                    }

                    REALTYPE* tmpCMatrices = gCMatrices[eigenIndex];
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
#ifdef UNROLL
                            int k = 0;
                            for (; k < stateCountModFour; k += 4) {
                                sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
                                sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
                                sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
                                sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
                            }
                            for (; k < kStateCount; k++) {
                                sum += tmpCMatrices[k] * matrixTmp[k];
                            }
                            tmpCMatrices += kStateCount;
#else
                            for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            n += T_PAD;
                        }
                    }
                }

                if (DEBUGGING_OUTPUT) {
                    int kMatrixSize = kStateCount * kStateCount;
                    fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
                    for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                        fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
                }
            }


        } else if (secondDerivativeIndices == NULL) {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k]; ///gCMatrices[eigenIndex] =  eigenVectors \otimes InveigenVectors
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        } else {
            for (int u = 0; u < count; u++) {
                REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
                REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
                REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
                int n = 0;
                for (int l = 0; l < kCategoryCount; l++) {

                    for (int i = 0; i < kStateCount; i++) {
                        REALTYPE scaledEigenValue = gEigenValues[eigenIndex][i] * ((REALTYPE)categoryRates[l]);
                        matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
                        firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
                        secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
                    }

                    int m = 0;
                    for (int i = 0; i < kStateCount; i++) {
                        for (int j = 0; j < kStateCount; j++) {
                            REALTYPE sum = 0.0;
                            REALTYPE sumD1 = 0.0;
                            REALTYPE sumD2 = 0.0;
                            for (int k = 0; k < kStateCount; k++) {
                                sum += gCMatrices[eigenIndex][m] * matrixTmp[k];
                                sumD1 += gCMatrices[eigenIndex][m] * firstDerivTmp[k];
                                sumD2 += gCMatrices[eigenIndex][m] * secondDerivTmp[k];
                                m++;
                            }
                            if (sum > 0)
                                transitionMat[n] = sum;
                            else
                                transitionMat[n] = 0;
                            firstDerivMat[n] = sumD1;
                            secondDerivMat[n] = sumD2;
                            n++;
                        }
                        if (T_PAD != 0) {
                            transitionMat[n] = 1.0;
                            firstDerivMat[n] = 0.0;
                            secondDerivMat[n] = 0.0;
                            n += T_PAD;
                        }
                    }
                }
            }
        }
//    }
}